

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams(MeshEdgebreakerTraversalDecoder *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  long in_RDI;
  ulong uVar6;
  int i;
  RAnsBitDecoder *in_stack_ffffffffffffff88;
  RAnsBitDecoder *in_stack_ffffffffffffff90;
  DecoderBuffer *in_stack_ffffffffffffffa0;
  RAnsBitDecoder *in_stack_ffffffffffffffa8;
  int local_28;
  
  if (0 < *(int *)(in_RDI + 200)) {
    uVar3 = (ulong)*(int *)(in_RDI + 200);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6);
    *puVar5 = uVar3;
    if (uVar3 != 0) {
      in_stack_ffffffffffffffa0 = (DecoderBuffer *)(puVar5 + 1 + uVar3 * 3);
      in_stack_ffffffffffffffa8 = (RAnsBitDecoder *)(puVar5 + 1);
      do {
        RAnsBitDecoder::RAnsBitDecoder(in_stack_ffffffffffffff90);
        in_stack_ffffffffffffffa8 = (RAnsBitDecoder *)((long)in_stack_ffffffffffffffa8 + 0x18);
      } while ((DecoderBuffer *)in_stack_ffffffffffffffa8 != in_stack_ffffffffffffffa0);
    }
    std::unique_ptr<draco::RAnsBitDecoder[],std::default_delete<draco::RAnsBitDecoder[]>>::
    unique_ptr<draco::RAnsBitDecoder*,std::default_delete<draco::RAnsBitDecoder[]>,void,bool>
              ((unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_> *
               )in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>::
    operator=((unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_> *)
              in_stack_ffffffffffffff90,
              (unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_> *)
              in_stack_ffffffffffffff88);
    std::unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>::
    ~unique_ptr((unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>
                 *)in_stack_ffffffffffffff90);
    for (local_28 = 0; local_28 < *(int *)(in_RDI + 200); local_28 = local_28 + 1) {
      std::unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>::
      operator[]((unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>
                  *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
      bVar2 = RAnsBitDecoder::StartDecoding(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (!bVar2) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool DecodeAttributeSeams() {
    // Prepare attribute decoding.
    if (num_attribute_data_ > 0) {
      attribute_connectivity_decoders_ = std::unique_ptr<BinaryDecoder[]>(
          new BinaryDecoder[num_attribute_data_]);
      for (int i = 0; i < num_attribute_data_; ++i) {
        if (!attribute_connectivity_decoders_[i].StartDecoding(&buffer_)) {
          return false;
        }
      }
    }
    return true;
  }